

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-binary-reader.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_cab7::BinaryReaderError::~BinaryReaderError(BinaryReaderError *this)

{
  (this->super_BinaryReaderNop).super_BinaryReaderDelegate._vptr_BinaryReaderDelegate =
       (_func_int **)&PTR__BinaryReaderError_00237ba8;
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

bool OnError(const Error& error) override {
    first_error = error;
    return true;  // Error handled.
  }